

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,2,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  bool *pbVar2;
  _Rb_tree_node_base *p_Var3;
  pointer pMVar4;
  pointer pMVar5;
  Variable<tcu::Matrix<float,_2,_3>_> *pVVar6;
  pointer pcVar7;
  Variable<tcu::Matrix<float,_3,_2>_> *pVVar8;
  byte bVar9;
  double dVar10;
  undefined8 uVar11;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar12;
  ulong uVar13;
  FloatFormat *fmt;
  pointer pMVar14;
  bool bVar15;
  ContextType type;
  int iVar16;
  uint uVar17;
  _Rb_tree_node_base *p_Var18;
  char *__s;
  size_t sVar19;
  long *plVar20;
  ShaderExecutor *pSVar21;
  IVal *pIVar22;
  IVal *pIVar23;
  TestError *this_00;
  bool bVar24;
  TestLog *pTVar25;
  Matrix<float,_2,_3> *val;
  string *psVar26;
  long lVar27;
  long lVar28;
  IVal *ival;
  byte bVar29;
  PrecisionCase *pPVar30;
  IVal in2;
  IVal reference1;
  IVal in3;
  ostringstream os;
  Environment env;
  FuncSet funcs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ShaderSpec spec;
  ostringstream oss;
  PrecisionCase *local_568;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_560;
  string local_558;
  IVal local_529;
  size_t local_528;
  Statement *local_520;
  ulong local_518;
  ulong local_510;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_508;
  long local_500;
  FloatFormat *local_4f8;
  string local_4f0;
  ulong local_4d0;
  ResultCollector *local_4c8;
  long local_4c0;
  undefined1 local_4b8 [8];
  pointer pVStack_4b0;
  undefined1 local_4a8 [16];
  Vector<float,_2> local_498;
  Data local_490;
  undefined4 local_480;
  undefined8 auStack_470 [5];
  ios_base local_448 [8];
  ios_base local_440 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_338;
  undefined1 local_308 [16];
  undefined1 local_2f8 [24];
  double local_2e0;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_278;
  FloatFormat local_248;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [72];
  undefined1 local_160 [304];
  
  pMVar4 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_528 = ((long)pMVar5 - (long)pMVar4 >> 3) * -0x5555555555555555;
  local_560 = variables;
  local_520 = stmt;
  local_508 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_278,local_528);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_248.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_248.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_248.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_248.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_248.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_248.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_248.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_248.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_248._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_338._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_338._M_impl.super__Rb_tree_header._M_header;
  local_338._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_338._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_338._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4b8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_338._M_impl.super__Rb_tree_header._M_header._M_right =
       local_338._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0,"Statement: ",0xb);
  (*local_520->_vptr_Statement[2])(local_520,(ostringstream *)&pVStack_4b0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_568 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4b0);
  std::ios_base::~ios_base(local_440);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var3 = (_Rb_tree_node_base *)(local_308 + 8);
  local_308._8_4_ = _S_red;
  local_2f8._0_8_ = (_Base_ptr)0x0;
  local_2e0 = 0.0;
  local_2f8._8_8_ = p_Var3;
  local_2f8._16_8_ = p_Var3;
  (*local_520->_vptr_Statement[4])(local_520,local_308);
  if ((_Rb_tree_node_base *)local_2f8._8_8_ != p_Var3) {
    p_Var18 = (_Rb_tree_node_base *)local_2f8._8_8_;
    do {
      (**(code **)(**(long **)(p_Var18 + 1) + 0x30))(*(long **)(p_Var18 + 1),local_1a8);
      p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
    } while (p_Var18 != p_Var3);
  }
  pPVar30 = local_568;
  if (local_2e0 != 0.0) {
    local_4b8 = (undefined1  [8])((local_568->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4b0,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4b0,local_558._M_dataplus._M_p,local_558._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4b0);
    std::ios_base::~ios_base(local_440);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_308);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_160 + 0x28));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"precision ",10);
  __s = glu::getPrecisionName((pPVar30->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)((long)&local_568 + (long)((TestLog *)((long)local_4b8 + -0x18))->m_log) +
                    0xb0);
  }
  else {
    sVar19 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,__s,sVar19);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar7 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar7) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
  std::ios_base::~ios_base(local_448);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_568->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_568->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_568->m_extension);
    plVar20 = (long *)std::__cxx11::string::append(local_1a8);
    pTVar25 = (TestLog *)(plVar20 + 2);
    if ((TestLog *)*plVar20 == pTVar25) {
      local_4a8._0_8_ = pTVar25->m_log;
      local_4a8._8_8_ = plVar20[3];
      local_4b8 = (undefined1  [8])local_4a8;
    }
    else {
      local_4a8._0_8_ = pTVar25->m_log;
      local_4b8 = (undefined1  [8])*plVar20;
    }
    pVStack_4b0 = (pointer)plVar20[1];
    *plVar20 = (long)pTVar25;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_4b8);
    if (local_4b8 != (undefined1  [8])local_4a8) {
      operator_delete((void *)local_4b8,(ulong)(local_4a8._0_8_ + 1));
    }
    if ((pointer)local_1a8._0_8_ != pcVar7) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Matrix<float,2,3>>
            ((Symbol *)local_4b8,local_568,
             (local_560->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
             .m_ptr);
  uVar11 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_4b8);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_498);
  glu::VarType::~VarType((VarType *)&local_498);
  if (local_4b8 != (undefined1  [8])local_4a8) {
    operator_delete((void *)local_4b8,(ulong)(local_4a8._0_8_ + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<tcu::Matrix<float,3,2>>
            ((Symbol *)local_4b8,local_568,
             (local_560->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr);
  uVar11 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_4b8);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_498);
  glu::VarType::~VarType((VarType *)&local_498);
  if (local_4b8 != (undefined1  [8])local_4a8) {
    operator_delete((void *)local_4b8,(ulong)(local_4a8._0_8_ + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
  (*local_520->_vptr_Statement[2])(local_520,local_4b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
  std::ios_base::~ios_base(local_448);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar7) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar30 = local_568;
  pSVar21 = ShaderExecUtil::createExecutor
                      ((local_568->m_ctx).renderContext,(local_568->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  local_4b8 = (undefined1  [8])
              (local_508->in0).
              super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pVStack_4b0 = (local_508->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_4a8._0_8_ =
       (local_508->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4a8._8_8_ =
       (local_508->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_278.out0.
       super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_278.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar21->_vptr_ShaderExecutor[3])
            (pSVar21,((pPVar30->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar16 = (*pSVar21->_vptr_ShaderExecutor[2])(pSVar21);
  if ((char)iVar16 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar21->_vptr_ShaderExecutor[5])(pSVar21);
  (*pSVar21->_vptr_ShaderExecutor[6])(pSVar21,local_528,local_4b8,local_1a8);
  (*pSVar21->_vptr_ShaderExecutor[1])(pSVar21);
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_4b8);
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_1a8);
  pVVar12 = local_560;
  Environment::bind<tcu::Matrix<float,2,3>>
            ((Environment *)&local_338,
             (local_560->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
             .m_ptr,(IVal *)local_4b8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_338,
             (pVVar12->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_308);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_338,
             (pVVar12->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_558);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_338,
             (pVVar12->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4f0);
  Environment::bind<tcu::Matrix<float,3,2>>
            ((Environment *)&local_338,
             (pVVar12->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_338,
             (pVVar12->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_529);
  if (pMVar5 == pMVar4) {
LAB_017a70c2:
    local_4b8 = (undefined1  [8])((pPVar30->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_4b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4b0," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4f8 = &(pPVar30->m_ctx).floatFormat;
    local_4c8 = &pPVar30->m_status;
    local_4d0 = local_528 + (local_528 == 0);
    local_500 = 0;
    local_518 = 0;
    local_510 = 0;
    do {
      tcu::Matrix<tcu::Interval,_3,_2>::Matrix((Matrix<tcu::Interval,_3,_2> *)local_1a8);
      if ((local_518 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_568->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_4f8;
      pMVar4 = (local_508->in0).
               super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_558._M_dataplus._M_p = (char *)0x0;
      local_558._M_string_length = 0;
      local_558.field_2._M_allocated_capacity = 0;
      lVar27 = 0;
      psVar26 = &local_558;
      bVar15 = true;
      do {
        bVar24 = bVar15;
        lVar28 = 0;
        do {
          *(undefined4 *)&(&psVar26->_M_dataplus)[lVar28]._M_p =
               *(undefined4 *)
                ((long)(pMVar4->m_data).m_data[lVar28].m_data + lVar27 * 4 + local_500);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        lVar27 = 1;
        psVar26 = (string *)((long)&local_558._M_dataplus._M_p + 4);
        bVar15 = false;
      } while (bVar24);
      ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doRound
                ((IVal *)local_308,local_4f8,(Matrix<float,_2,_3> *)&local_558);
      ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doConvert
                ((IVal *)local_4b8,fmt,(IVal *)local_308);
      pIVar22 = Environment::lookup<tcu::Matrix<float,2,3>>
                          ((Environment *)&local_338,
                           (local_560->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
                           .m_ptr);
      pVVar12 = local_560;
      pPVar30 = local_568;
      lVar27 = 0;
      pIVar23 = (IVal *)local_4b8;
      bVar15 = true;
      do {
        bVar24 = bVar15;
        lVar28 = 0;
        do {
          *(undefined8 *)((long)&(pIVar22->m_data).m_data[0].m_data[lVar27].m_hi + lVar28) =
               *(undefined8 *)((long)&(pIVar23->m_data).m_data[0].m_data[0].m_hi + lVar28);
          pbVar1 = &(pIVar23->m_data).m_data[0].m_data[0].m_hasNaN + lVar28;
          dVar10 = *(double *)(pbVar1 + 8);
          pbVar2 = &(pIVar22->m_data).m_data[0].m_data[lVar27].m_hasNaN + lVar28;
          *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
          *(double *)(pbVar2 + 8) = dVar10;
          lVar28 = lVar28 + 0x30;
        } while (lVar28 != 0x90);
        lVar27 = 1;
        pIVar23 = (IVal *)(local_4a8 + 8);
        bVar15 = false;
      } while (bVar24);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_338,
                 (local_560->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_338,
                 (pVVar12->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_338,
                 (pVVar12->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_490.basic.type = (pPVar30->m_ctx).precision;
      local_498.m_data = (float  [2])local_4f8->m_maxValue;
      local_4b8 = *(undefined1 (*) [8])local_4f8;
      pVStack_4b0 = *(pointer *)&local_4f8->m_fractionBits;
      local_4a8._0_8_ = *(undefined8 *)&local_4f8->m_hasInf;
      local_4a8._8_8_ = *(undefined8 *)&local_4f8->m_exactPrecision;
      local_480 = 0;
      local_490._8_8_ = &local_338;
      (*local_520->_vptr_Statement[3])(local_520,(IVal *)local_4b8);
      pIVar23 = Environment::lookup<tcu::Matrix<float,3,2>>
                          ((Environment *)&local_338,
                           (local_560->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_2>,_tcu::Matrix<tcu::Interval,_3,_2>_>::doConvert
                ((IVal *)local_4b8,&local_248,pIVar23);
      pMVar14 = local_278.out0.
                super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = local_518;
      lVar27 = 0;
      do {
        *(undefined8 *)(local_1a8 + lVar27 + 0x10) = *(undefined8 *)(local_4a8 + lVar27);
        *(undefined8 *)(local_1a8 + lVar27) = *(undefined8 *)(local_4b8 + lVar27);
        *(undefined8 *)(local_1a8 + lVar27 + 8) = *(undefined8 *)((long)&pVStack_4b0 + lVar27);
        uVar11 = *(undefined8 *)((long)auStack_470 + lVar27 + 8);
        *(undefined8 *)(local_160 + lVar27) = *(undefined8 *)((long)auStack_470 + lVar27);
        *(undefined8 *)(local_160 + lVar27 + 8) = uVar11;
        *(undefined8 *)(local_160 + lVar27 + 0x10) =
             *(undefined8 *)((long)auStack_470 + lVar27 + 0x10);
        lVar27 = lVar27 + 0x18;
      } while (lVar27 != 0x48);
      local_4c0 = local_518 * 0x18;
      bVar29 = 1;
      lVar27 = 0;
      ival = (IVal *)local_1a8;
      do {
        bVar15 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                           (ival,pMVar14[uVar13].m_data.m_data + lVar27);
        lVar27 = 1;
        bVar9 = bVar29 & bVar15;
        bVar29 = 0;
        ival = (IVal *)local_160;
      } while (bVar9 != 0);
      local_4b8 = (undefined1  [8])local_4a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4b8,"Shader output 0 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(local_4c8,bVar15,(string *)local_4b8);
      if (local_4b8 != (undefined1  [8])local_4a8) {
        operator_delete((void *)local_4b8,(ulong)(local_4a8._0_8_ + 1));
      }
      if (!bVar15) {
        uVar17 = (int)local_510 + 1;
        local_510 = (ulong)uVar17;
        if ((int)uVar17 < 0x65) {
          local_4b8 = (undefined1  [8])((local_568->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0,"Failed",6);
          lVar27 = local_4c0;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0,"\t",1);
          pVVar6 = (local_560->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
                   .m_ptr;
          val = (Matrix<float,_2,_3> *)(local_308 + 0x10);
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_308._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_308,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4b0,(char *)local_308._0_8_,
                     CONCAT44(local_308._12_4_,local_308._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0," = ",3);
          valueToString<tcu::Matrix<float,2,3>>
                    (&local_558,(BuiltinPrecisionTests *)&local_248,
                     (FloatFormat *)
                     ((long)(((local_508->in0).
                              super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                     lVar27),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4b0,local_558._M_dataplus._M_p,local_558._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_558._M_dataplus._M_p != &local_558.field_2) {
            operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_2,_3> *)local_308._0_8_ != (Matrix<float,_2,_3> *)(local_308 + 0x10)) {
            operator_delete((void *)local_308._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_2f8._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0,"\t",1);
          pVVar8 = (local_560->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                   .m_ptr;
          pIVar23 = (IVal *)(local_308 + 0x10);
          pcVar7 = (pVVar8->m_name)._M_dataplus._M_p;
          local_308._0_8_ = pIVar23;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_308,pcVar7,pcVar7 + (pVVar8->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4b0,(char *)local_308._0_8_,
                     CONCAT44(local_308._12_4_,local_308._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0," = ",3);
          valueToString<tcu::Matrix<float,3,2>>
                    (&local_558,(BuiltinPrecisionTests *)&local_248,
                     (FloatFormat *)
                     ((long)((local_278.out0.
                              super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                     lVar27),(Matrix<float,_3,_2> *)pIVar23);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4b0,local_558._M_dataplus._M_p,local_558._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4b0,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,3,2>>
                    (&local_4f0,(BuiltinPrecisionTests *)&local_248,(FloatFormat *)local_1a8,pIVar23
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4b0,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
            operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_558._M_dataplus._M_p != &local_558.field_2) {
            operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_308._0_8_ != (IVal *)(local_308 + 0x10)) {
            operator_delete((void *)local_308._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_2f8._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4b0);
          std::ios_base::~ios_base(local_440);
        }
      }
      pPVar30 = local_568;
      local_518 = local_518 + 1;
      local_500 = local_500 + 0x18;
    } while (local_518 != local_4d0);
    iVar16 = (int)local_510;
    if (iVar16 < 0x65) {
      if (iVar16 == 0) goto LAB_017a70c2;
    }
    else {
      local_4b8 = (undefined1  [8])((local_568->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_4b0,iVar16 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4b0);
      std::ios_base::~ios_base(local_440);
    }
    local_4b8 = (undefined1  [8])((pPVar30->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4b0);
    std::ostream::operator<<((ostringstream *)&pVStack_4b0,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4b0,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_4b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4b0," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4b0);
  std::ios_base::~ios_base(local_440);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_278.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.out0.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}